

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::
statement_inner<std::__cxx11::string_const&,char_const(&)[13],unsigned_int_const&,char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
          (CompilerGLSL *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
          char (*ts) [13],uint *ts_1,char **ts_2,char (*ts_3) [4],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4,char (*ts_5) [2])

{
  StringStream<4096UL,_4096UL> *this_00;
  char *__s;
  size_t sVar1;
  
  this_00 = &this->buffer;
  StringStream<4096UL,_4096UL>::append(this_00,(t->_M_dataplus)._M_p,t->_M_string_length);
  this->statement_count = this->statement_count + 1;
  sVar1 = strlen(*ts);
  StringStream<4096UL,_4096UL>::append(this_00,*ts,sVar1);
  this->statement_count = this->statement_count + 1;
  StringStream<4096UL,_4096UL>::operator<<(this_00,*ts_1);
  this->statement_count = this->statement_count + 1;
  __s = *ts_2;
  sVar1 = strlen(__s);
  StringStream<4096UL,_4096UL>::append(this_00,__s,sVar1);
  this->statement_count = this->statement_count + 1;
  sVar1 = strlen(*ts_3);
  StringStream<4096UL,_4096UL>::append(this_00,*ts_3,sVar1);
  this->statement_count = this->statement_count + 1;
  StringStream<4096UL,_4096UL>::append(this_00,(ts_4->_M_dataplus)._M_p,ts_4->_M_string_length);
  this->statement_count = this->statement_count + 1;
  sVar1 = strlen(*ts_5);
  StringStream<4096UL,_4096UL>::append(this_00,*ts_5,sVar1);
  this->statement_count = this->statement_count + 1;
  return;
}

Assistant:

inline void statement_inner(T &&t, Ts &&... ts)
	{
		buffer << std::forward<T>(t);
		statement_count++;
		statement_inner(std::forward<Ts>(ts)...);
	}